

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtility.h
# Opt level: O0

void assert::are_equal<char[12],std::__cxx11::string>
               (char (*expected) [12],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual,string *msg
               )

{
  ostream *poVar1;
  string *in_RDX;
  string *in_RSI;
  char *in_RDI;
  ostringstream s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  string local_1c0 [24];
  string *in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe67;
  ostringstream local_190 [384];
  string *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,in_RDX);
  poVar1 = std::operator<<(poVar1,"(expected: ");
  poVar1 = std::operator<<(poVar1,local_8);
  poVar1 = std::operator<<(poVar1,", actual: ");
  poVar1 = std::operator<<(poVar1,local_10);
  std::operator<<(poVar1,")");
  std::operator==((char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                  in_stack_fffffffffffffdf8);
  std::__cxx11::ostringstream::str();
  is_true((bool)in_stack_fffffffffffffe67,in_stack_fffffffffffffe58);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void are_equal(const T1& expected, const T2& actual, std::string msg = "")
    {
        std::ostringstream s{};
        s << msg << "(expected: " << expected << ", actual: " << actual << ")";
        is_true(expected == actual, s.str());
    }